

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall CoreML::Model::toStringStream(Model *this,stringstream *ss)

{
  Rep *pRVar1;
  int iVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  ModelDescription *pMVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  ModelDescription *pMVar8;
  long lVar9;
  void **ppvVar10;
  long lVar11;
  
  poVar7 = (ostream *)(ss + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Spec version: ",0xe);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar7,
                      ((this->m_spec).
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->specificationversion_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Model type: ",0xc);
  __s = MLModelType_Name(((this->m_spec).
                          super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_oneof_case_[0]);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Interface:",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Inputs:",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  pMVar5 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar5 == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar5->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar11 = (long)(pMVar5->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    lVar9 = 0;
    do {
      writeFeatureDescription(ss,*(FeatureDescription **)((long)ppvVar10 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar11 * 8 != lVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Outputs:",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  pMVar5 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  pMVar8 = pMVar5;
  if (pMVar5 == (ModelDescription *)0x0) {
    pMVar8 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar8->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  lVar11 = (long)(pMVar8->output_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar11 != 0) {
    lVar9 = 0;
    do {
      writeFeatureDescription(ss,*(FeatureDescription **)((long)ppvVar10 + lVar9));
      lVar9 = lVar9 + 8;
    } while (lVar11 * 8 != lVar9);
    pMVar5 = ((this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             description_;
  }
  if (pMVar5 == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  iVar2 = std::__cxx11::string::compare
                    ((char *)((ulong)(pMVar5->predictedfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe));
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Predicted feature name: ",0x18);
    pMVar5 = ((this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             description_;
    if (pMVar5 == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    puVar6 = (undefined8 *)
             ((ulong)(pMVar5->predictedfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  pMVar5 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar5 == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  iVar2 = std::__cxx11::string::compare
                    ((char *)((ulong)(pMVar5->predictedprobabilitiesname_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe));
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Predicted probability name: ",0x1c);
    pMVar5 = ((this->m_spec).
              super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             description_;
    if (pMVar5 == (ModelDescription *)0x0) {
      pMVar5 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
    }
    puVar6 = (undefined8 *)
             ((ulong)(pMVar5->predictedprobabilitiesname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)*puVar6,puVar6[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    return;
  }
  return;
}

Assistant:

void Model::toStringStream(std::stringstream& ss) const {
        ss << "Spec version: " << m_spec->specificationversion() << "\n";
        ss << "Model type: " << MLModelType_Name(static_cast<MLModelType>(m_spec->Type_case())) << "\n";
        ss << "Interface:" << "\n";
        ss << "\t" << "Inputs:" << "\n";
        for (const auto& input : m_spec->description().input()) {
            writeFeatureDescription(ss, input);
        }
        ss << "\t" << "Outputs:" << "\n";
        for (const auto& output : m_spec->description().output()) {
            writeFeatureDescription(ss, output);
        }
        if (m_spec->description().predictedfeaturename() != "") {
            ss << "\t" << "Predicted feature name: " << m_spec->description().predictedfeaturename() << "\n";
        }
        if (m_spec->description().predictedprobabilitiesname() != "") {
            ss << "\t" << "Predicted probability name: " << m_spec->description().predictedprobabilitiesname() << "\n";
        }
    }